

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form3_BitwiseOr(BitwiseOrForm3 BitwiseOr)

{
  value_type vVar1;
  initializer_list<PenguinV_Image::ImageTemplate<unsigned_char>_> __l;
  bool bVar2;
  const_reference pvVar3;
  reference pvVar4;
  const_reference pvVar5;
  code *in_RDI;
  Image output;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  value_type height;
  uint32_t in_stack_fffffffffffffd9c;
  uint8_t value;
  undefined2 in_stack_fffffffffffffda4;
  uint8_t in_stack_fffffffffffffda6;
  uint8_t in_stack_fffffffffffffda7;
  uint32_t in_stack_fffffffffffffda8;
  uint32_t in_stack_fffffffffffffdac;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffdb0;
  Image *in_stack_fffffffffffffdb8;
  uint32_t in_stack_fffffffffffffdc4;
  uint32_t in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  size_type in_stack_fffffffffffffde0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  bool local_212;
  uint32_t *in_stack_fffffffffffffe00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint32_t *in_stack_fffffffffffffe08;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe10;
  size_type __n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  value_type vVar6;
  undefined4 in_stack_fffffffffffffe24;
  value_type vVar7;
  undefined1 **local_1a0;
  undefined1 local_170 [40];
  undefined4 local_148;
  undefined4 local_144;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_140;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_128;
  undefined1 local_109;
  undefined8 *local_a8;
  undefined1 *local_a0 [5];
  undefined1 local_78 [40];
  undefined8 *local_50;
  undefined8 local_48;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  code *local_10;
  
  local_10 = in_RDI;
  Unit_Test::intensityArray(in_stack_fffffffffffffd9c);
  local_109 = 1;
  local_a8 = local_a0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,in_stack_fffffffffffffda8,
             in_stack_fffffffffffffda7,in_stack_fffffffffffffda6);
  Test_Helper::uniformImage
            ((uint8_t)((uint)in_stack_fffffffffffffdcc >> 0x18),in_stack_fffffffffffffdc8,
             in_stack_fffffffffffffdc4,in_stack_fffffffffffffdb8);
  local_a8 = (undefined8 *)local_78;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,1);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,in_stack_fffffffffffffda8,
             in_stack_fffffffffffffda7,in_stack_fffffffffffffda6);
  Test_Helper::uniformImage
            ((uint8_t)((uint)in_stack_fffffffffffffdcc >> 0x18),in_stack_fffffffffffffdc8,
             in_stack_fffffffffffffdc4,in_stack_fffffffffffffdb8);
  local_109 = 0;
  local_50 = local_a0;
  local_48 = 2;
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x1cf246);
  __l._M_array._7_1_ = in_stack_fffffffffffffddf;
  __l._M_array._0_7_ = in_stack_fffffffffffffdd8;
  __l._M_len = in_stack_fffffffffffffde0;
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector(in_stack_fffffffffffffdd0,__l,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::~allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x1cf27a);
  local_1a0 = (undefined1 **)&local_50;
  do {
    local_1a0 = local_1a0 + -5;
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x1cf2af);
  } while (local_1a0 != local_a0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1cf2d9);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1cf2e6);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1cf2fb);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1cf310);
  Unit_Test::generateRoi
            ((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             in_stack_fffffffffffffe00);
  pvVar3 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](&local_40,0);
  this_00 = &local_128;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,0);
  vVar6 = *pvVar4;
  this_01 = &local_140;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,0);
  vVar7 = *pvVar4;
  __n = 1;
  pvVar5 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](&local_40,1);
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,__n);
  vVar1 = *pvVar4;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,__n);
  height = *pvVar4;
  (*local_10)(local_170,pvVar3,vVar6,vVar7,pvVar5,vVar1,height,local_144,local_148);
  bVar2 = Unit_Test::equalSize
                    ((Image *)CONCAT17(in_stack_fffffffffffffda7,
                                       CONCAT16(in_stack_fffffffffffffda6,
                                                CONCAT24(in_stack_fffffffffffffda4,local_144))),
                     in_stack_fffffffffffffd9c,height);
  value = (uint8_t)(in_stack_fffffffffffffd9c >> 0x18);
  local_212 = false;
  if (bVar2) {
    this = &local_28;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,1);
    local_212 = Unit_Test::verifyImage
                          ((Image *)CONCAT17(in_stack_fffffffffffffda7,
                                             CONCAT16(in_stack_fffffffffffffda6,
                                                      CONCAT24(in_stack_fffffffffffffda4,local_144))
                                            ),value);
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1cf4ee);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffdb0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffdb0);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)in_stack_fffffffffffffdb0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdb0);
  return (bool)(local_212 & 1);
}

Assistant:

bool form3_BitwiseOr(BitwiseOrForm3 BitwiseOr)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const std::vector < PenguinV_Image::Image > input = { uniformImage( intensity[0] ), uniformImage( intensity[1] ) };

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const PenguinV_Image::Image output = BitwiseOr( input[0], roiX[0], roiY[0], input[1], roiX[1], roiY[1], roiWidth, roiHeight );

        return equalSize( output, roiWidth, roiHeight ) && verifyImage( output, intensity[0] | intensity[1] );
    }